

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<double,_signed_char>::Run
          (DataTransform<double,_signed_char> *this,istream *input_stream)

{
  char cVar1;
  NumericType NVar2;
  WarningType WVar3;
  char *__nptr;
  bool bVar4;
  int *piVar5;
  undefined8 uVar6;
  ostream *poVar7;
  size_t sVar8;
  char cVar9;
  char data_to_write;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar15;
  double input_data;
  string word;
  char buffer [128];
  double local_268;
  string local_260;
  string *local_240;
  double local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_240 = &this->print_format_;
  iVar14 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar13 = 2;
        bVar4 = false;
      }
      else {
        piVar5 = __errno_location();
        iVar13 = *piVar5;
        *piVar5 = 0;
        strtold(__nptr,(char **)&local_260);
        if (local_260._M_dataplus._M_p == __nptr) {
          uVar6 = std::__throw_invalid_argument("stold");
LAB_00140f3f:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar6);
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar13;
        }
        else if (*piVar5 == 0x22) {
          uVar6 = std::__throw_out_of_range("stold");
          goto LAB_00140f3f;
        }
        local_268 = (double)in_ST0;
        iVar13 = 0;
        bVar4 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar4) {
LAB_00140c27:
        cVar9 = (char)(int)local_268;
        data_to_write = this->minimum_value_;
        cVar1 = this->maximum_value_;
        if (data_to_write < cVar1) {
          NVar2 = this->input_numeric_type_;
          if (NVar2 == kFloatingPoint) {
            local_238 = local_268;
            bVar4 = true;
            in_ST6 = in_ST5;
            in_ST7 = in_ST5;
            if (((double)(short)data_to_write <= local_268) &&
               (data_to_write = cVar1, local_268 <= (double)(short)cVar1)) goto LAB_00140cf4;
          }
          else {
            uVar10 = (ulong)cVar1;
            if (NVar2 == kUnsignedInteger) {
              uVar12 = (long)(local_268 - 9.223372036854776e+18) & (long)local_268 >> 0x3f |
                       (long)local_268;
              bVar4 = true;
              if (((ulong)(long)data_to_write <= uVar12) &&
                 (bVar4 = uVar10 < uVar12, data_to_write = cVar9, bVar4)) {
                data_to_write = cVar1;
              }
            }
            else {
              if (NVar2 != kSignedInteger) goto LAB_00140cf4;
              lVar11 = (long)local_268;
              bVar4 = true;
              if ((data_to_write <= lVar11) &&
                 (bVar4 = (long)uVar10 < lVar11, data_to_write = cVar9, (long)uVar10 < lVar11)) {
                data_to_write = cVar1;
              }
            }
          }
        }
        else {
LAB_00140cf4:
          bVar4 = false;
          data_to_write = cVar9;
        }
        if ((!bVar4) && (this->rounding_ != false)) {
          if (local_268 <= 0.0) {
            dVar15 = local_268 + -0.5;
          }
          else {
            dVar15 = local_268 + 0.5;
          }
          data_to_write = (char)(int)dVar15;
        }
        if ((bool)(bVar4 & this->warning_type_ != kIgnore)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"th data is over the range of output type",0x28);
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"x2x","");
          sptk::PrintErrorMessage(&local_260,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar13 = 1;
          if (WVar3 == kExit) goto LAB_00140e8f;
        }
        if (this->is_ascii_output_ == true) {
          bVar4 = sptk::SnPrintf<signed_char>(data_to_write,local_240,0x80,local_b8);
          iVar13 = 1;
          if (bVar4) {
            sVar8 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar8)
            ;
            if ((iVar14 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_00140e8c:
            iVar13 = 0;
          }
        }
        else {
          bVar4 = sptk::WriteStream<signed_char>(data_to_write,(ostream *)&std::cout);
          iVar13 = 1;
          if (bVar4) goto LAB_00140e8c;
        }
      }
    }
    else {
      bVar4 = sptk::ReadStream<double>(&local_268,input_stream);
      iVar13 = 2;
      if (bVar4) goto LAB_00140c27;
    }
LAB_00140e8f:
    if (iVar13 != 0) {
      if (iVar13 == 2) {
        bVar4 = true;
        if ((this->is_ascii_output_ == true) && (iVar14 % this->num_column_ != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }